

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void andres::marray_detail::
     operate<andres::marray_detail::PrefixIncrement<int>,int,std::allocator<unsigned_long>>
               (View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  size_t sVar2;
  reference piVar3;
  reference x;
  undefined1 local_68 [8];
  iterator it;
  ulong local_28;
  size_t j;
  int *data;
  View<int,_false,_std::allocator<unsigned_long>_> *v_local;
  
  bVar1 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(v);
  if (bVar1) {
    piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)v,0);
    for (local_28 = 0; sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::size(v),
        local_28 < sVar2; local_28 = local_28 + 1) {
      PrefixIncrement<int>::operator()
                ((PrefixIncrement<int> *)((long)&v_local + 7),piVar3 + local_28);
    }
  }
  else {
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar2 == 1) {
      piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)v,0);
      OperateHelperUnary<(unsigned_short)1,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
      ::operate(v,piVar3);
    }
    else {
      sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar2 == 2) {
        piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)v,0);
        OperateHelperUnary<(unsigned_short)2,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
        ::operate(v,piVar3);
      }
      else {
        sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
        if (sVar2 == 3) {
          piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)v,0);
          OperateHelperUnary<(unsigned_short)3,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
          ::operate(v,piVar3);
        }
        else {
          sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar2 == 4) {
            piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                               ((View<int,false,std::allocator<unsigned_long>> *)v,0);
            OperateHelperUnary<(unsigned_short)4,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
            ::operate(v,piVar3);
          }
          else {
            sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
            if (sVar2 == 5) {
              piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)v,0);
              OperateHelperUnary<(unsigned_short)5,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
              ::operate(v,piVar3);
            }
            else {
              sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
              if (sVar2 == 6) {
                piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                                   ((View<int,false,std::allocator<unsigned_long>> *)v,0);
                OperateHelperUnary<(unsigned_short)6,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
                ::operate(v,piVar3);
              }
              else {
                sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
                if (sVar2 == 7) {
                  piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)v,0);
                  OperateHelperUnary<(unsigned_short)7,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
                  ::operate(v,piVar3);
                }
                else {
                  sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
                  if (sVar2 == 8) {
                    piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                                       ((View<int,false,std::allocator<unsigned_long>> *)v,0);
                    OperateHelperUnary<(unsigned_short)8,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
                    ::operate(v,piVar3);
                  }
                  else {
                    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
                    if (sVar2 == 9) {
                      piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)v,0);
                      OperateHelperUnary<(unsigned_short)9,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
                      ::operate(v,piVar3);
                    }
                    else {
                      sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(v);
                      if (sVar2 == 10) {
                        piVar3 = View<int,false,std::allocator<unsigned_long>>::operator()
                                           ((View<int,false,std::allocator<unsigned_long>> *)v,0);
                        OperateHelperUnary<(unsigned_short)10,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
                        ::operate(v,piVar3);
                      }
                      else {
                        View<int,_false,_std::allocator<unsigned_long>_>::begin
                                  ((iterator *)local_68,v);
                        while (bVar1 = Iterator<int,_false,_std::allocator<unsigned_long>_>::hasMore
                                                 ((
                                                  Iterator<int,_false,_std::allocator<unsigned_long>_>
                                                  *)local_68), bVar1) {
                          x = Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_68);
                          PrefixIncrement<int>::operator()
                                    ((PrefixIncrement<int> *)((long)&v_local + 7),x);
                          Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                     local_68);
                        }
                        Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
                                  ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_68)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T, false, A>& v, 
    Functor f
)
{
    if(v.isSimple()) {
        T* data = &v(0);
        for(std::size_t j=0; j<v.size(); ++j) {
            f(data[j]);
        }
    }
    else if(v.dimension() == 1)
        OperateHelperUnary<1, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 2)
        OperateHelperUnary<2, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 3)
        OperateHelperUnary<3, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 4)
        OperateHelperUnary<4, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 5)
        OperateHelperUnary<5, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 6)
        OperateHelperUnary<6, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 7)
        OperateHelperUnary<7, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 8)
        OperateHelperUnary<8, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 9)
        OperateHelperUnary<9, Functor, T, A>::operate(v, f, &v(0));
    else if(v.dimension() == 10)
        OperateHelperUnary<10, Functor, T, A>::operate(v, f, &v(0));
    else {
        for(typename View<T, false, A>::iterator it = v.begin(); it.hasMore(); ++it) {
            f(*it);
        }
    }
}